

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

void yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonUIntValReq>::
     _throwLowerGtUpper<long_long,long_long>(longlong lower,longlong upper,TextLocation *loc)

{
  string msg;
  ostream *poVar1;
  ostringstream ss;
  undefined7 in_stack_fffffffffffffe40;
  char cVar2;
  TextLocation in_stack_fffffffffffffe48;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is greater than ",0x11);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  cVar2 = '.';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&stack0xfffffffffffffe47,1);
  std::__cxx11::stringbuf::str();
  msg.field_2._8_7_ = in_stack_fffffffffffffe40;
  msg._0_24_ = *loc;
  msg.field_2._M_local_buf[0xf] = cVar2;
  throwTextParseError(msg,in_stack_fffffffffffffe48);
}

Assistant:

static void _throwLowerGtUpper(const LowerT lower, const UpperT upper, const TextLocation& loc)
    {
        std::ostringstream ss;

        ss << lower << " is greater than " << upper << '.';
        throwTextParseError(ss.str(), loc);
    }